

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O1

int __thiscall embree::FastAllocator::init(FastAllocator *this,EVP_PKEY_CTX *ctx)

{
  Device *pDVar1;
  int extraout_EAX;
  Block *pBVar2;
  ulong uVar3;
  ulong in_RCX;
  int iVar4;
  EVP_PKEY_CTX *in_RDX;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  
  internal_fix_used_blocks(this);
  this->slotMask = 7;
  if (((this->usedBlocks)._M_b._M_p == (__pointer_type)0x0) &&
     ((this->freeBlocks)._M_b._M_p == (__pointer_type)0x0)) {
    if (in_RDX == (EVP_PKEY_CTX *)0x0) {
      in_RDX = ctx;
    }
    pBVar2 = Block::create(this->device,this->useUSM,(size_t)ctx,(size_t)in_RDX,(Block *)0x0,
                           this->atype);
    LOCK();
    (this->freeBlocks)._M_b._M_p = pBVar2;
    UNLOCK();
    this->estimatedSize = in_RCX;
    uVar3 = (in_RCX >> 3) + 0x7f & 0xffffffffffffff80;
    uVar5 = 0x1fffc0;
    if (uVar3 < 0x1fffc0) {
      uVar5 = uVar3;
    }
    if (uVar5 < 0x401) {
      uVar5 = 0x400;
    }
    this->use_single_mode = false;
    this->maxGrowSize = uVar5;
    this->growSize = uVar5;
    iVar4 = (int)uVar5;
    sVar6 = 3;
    if (in_RCX <= (uint)(iVar4 << 5)) {
      sVar6 = (ulong)((uint)(iVar4 << 4) < in_RCX);
    }
    sVar7 = 7;
    if (in_RCX <= (uint)(iVar4 << 6)) {
      sVar7 = sVar6;
    }
    this->slotMask = sVar7;
    if ((uint)(iVar4 << 7) < in_RCX) {
      this->growSize = uVar5 * 2;
    }
    uVar5 = 0x1040;
    if (uVar3 < 0x1040) {
      uVar5 = uVar3;
    }
    uVar3 = 0x400;
    if (0x400 < uVar5) {
      uVar3 = uVar5;
    }
    this->defaultBlockSize = uVar3;
    if (in_RCX == 0) {
      this->maxGrowSize = 0x1fffc0;
      this->defaultBlockSize = 0x1040;
    }
    LOCK();
    (this->log2_grow_size_scale).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    pDVar1 = this->device;
    sVar6 = (pDVar1->super_State).alloc_main_block_size;
    if (sVar6 != 0) {
      this->growSize = sVar6;
    }
    if (0 < (pDVar1->super_State).alloc_num_main_slots) {
      this->slotMask = 0;
    }
    if (1 < (pDVar1->super_State).alloc_num_main_slots) {
      this->slotMask = 1;
    }
    if (3 < (pDVar1->super_State).alloc_num_main_slots) {
      this->slotMask = 3;
    }
    if (7 < (pDVar1->super_State).alloc_num_main_slots) {
      this->slotMask = 7;
    }
    sVar6 = (pDVar1->super_State).alloc_thread_block_size;
    if (sVar6 != 0) {
      this->defaultBlockSize = sVar6;
    }
    iVar4 = (pDVar1->super_State).alloc_single_thread_alloc;
    if (iVar4 != -1) {
      this->use_single_mode = iVar4 != 0;
    }
    return iVar4;
  }
  reset(this);
  return extraout_EAX;
}

Assistant:

void init(size_t bytesAllocate, size_t bytesReserve, size_t bytesEstimate)
    {
      internal_fix_used_blocks();
      /* distribute the allocation to multiple thread block slots */
      slotMask = MAX_THREAD_USED_BLOCK_SLOTS-1; // FIXME: remove
      if (usedBlocks.load() || freeBlocks.load()) { reset(); return; }
      if (bytesReserve == 0) bytesReserve = bytesAllocate;
      freeBlocks = Block::create(device,useUSM,bytesAllocate,bytesReserve,nullptr,atype);
      estimatedSize = bytesEstimate;
      initGrowSizeAndNumSlots(bytesEstimate,true);
    }